

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_fma.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution1D_x86_fma::create_pipeline(Convolution1D_x86_fma *this,Option *param_1)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  _func_int *p_Var4;
  long lVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  uint uVar9;
  undefined4 *puVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  void *pvVar17;
  void *pvVar18;
  undefined4 *puVar19;
  int k_2;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  ulong uVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  uint _w;
  int iVar30;
  long lVar31;
  long lVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  int k_5;
  int iVar36;
  int iVar37;
  int k;
  long lVar38;
  long lVar39;
  ulong uVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  int iVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  undefined4 *puVar49;
  long lVar50;
  long lVar51;
  ulong uVar52;
  long lVar53;
  ulong uVar54;
  long lVar55;
  long lVar56;
  ulong local_150;
  long local_148;
  long local_138;
  long local_130;
  long local_120;
  
  p_Var4 = this->_vptr_Convolution1D_x86_fma[-3];
  if (*(int *)(&this->field_0x140 + (long)p_Var4) != 0) {
    return 0;
  }
  uVar2 = *(uint *)(&this->field_0xd4 + (long)p_Var4);
  lVar31 = (long)(int)uVar2;
  uVar54 = (ulong)uVar2;
  uVar22 = (long)*(int *)(&this->field_0xf0 + (long)p_Var4) / (long)(int)uVar2;
  uVar3 = *(uint *)(&this->field_0xd0 + (long)p_Var4);
  uVar26 = (ulong)(int)uVar3;
  uVar22 = (long)((ulong)(uint)((int)uVar22 >> 0x1f) << 0x20 | uVar22 & 0xffffffff) /
           (long)(int)uVar3;
  uVar9 = (uint)uVar22;
  uVar20 = uVar9;
  if ((long)uVar26 < 8) {
    if ((int)uVar3 < 4) {
      if ((int)uVar3 < 2) {
        uVar13 = uVar3;
        if ((int)uVar9 < 8) {
          if ((int)uVar9 < 4) {
            _w = uVar2;
            if (1 < (int)uVar9) {
              uVar20 = (uVar9 & 1) + 1;
              _w = uVar2 * 2;
            }
          }
          else {
            _w = uVar2 * 4;
            uVar20 = (uVar9 & 1) + 1 + (uint)((uVar9 >> 1 & 1) != 0);
          }
        }
        else {
          _w = uVar2 * 8;
          uVar20 = (uVar9 & 1) + (uVar9 >> 3) + (uVar9 >> 2 & 1) + (uint)((uVar9 >> 1 & 1) != 0);
        }
      }
      else {
        if ((int)uVar9 < 8) {
          if ((int)uVar9 < 4) {
            if ((int)uVar9 < 2) {
              _w = uVar2 * 2;
            }
            else {
              _w = uVar2 * 4;
              uVar20 = (uVar9 & 1) + 1;
            }
            uVar13 = (uVar3 & 1) + 1;
            goto LAB_00535bca;
          }
          uVar20 = (uVar9 & 1) + 1 + (uint)((uVar9 >> 1 & 1) != 0);
          _w = uVar2 * 8;
        }
        else {
          _w = uVar2 << 4;
          uVar20 = (uVar9 & 1) + (uVar9 >> 3) + (uVar9 >> 2 & 1) + (uint)((uVar9 >> 1 & 1) != 0);
        }
        uVar13 = (uVar3 & 1) + 1;
      }
    }
    else {
      if ((int)uVar9 < 8) {
        if ((int)uVar9 < 4) {
          if ((int)uVar9 < 2) {
            _w = uVar2 * 4;
          }
          else {
            _w = uVar2 * 8;
            uVar20 = (uVar9 & 1) + 1;
          }
          uVar13 = (uVar3 & 1) + 1 + (uint)((uVar3 >> 1 & 1) != 0);
          goto LAB_00535bca;
        }
        _w = uVar2 << 4;
        uVar20 = (uVar9 & 1) + 1 + (uint)((uVar9 >> 1 & 1) != 0);
      }
      else {
        _w = uVar2 << 5;
        uVar20 = (uVar9 & 1) + (uVar9 >> 3) + (uVar9 >> 2 & 1) + (uint)((uVar9 >> 1 & 1) != 0);
      }
      uVar13 = (uVar3 & 1) + 1 + (uint)((uVar3 >> 1 & 1) != 0);
    }
  }
  else {
    uVar22 = uVar22 & 0xffffffff;
    if ((int)uVar9 < 8) {
      if ((int)uVar9 < 4) {
        if ((int)uVar9 < 2) {
          _w = uVar2 * 8;
          uVar13 = (uVar3 & 1) + (uVar3 >> 3) + (uVar3 >> 2 & 1) + (uint)((uVar3 >> 1 & 1) != 0);
        }
        else {
          _w = uVar2 << 4;
          uVar13 = (uVar3 & 1) + (uVar3 >> 3) + (uVar3 >> 2 & 1) + (uint)((uVar3 >> 1 & 1) != 0);
          uVar20 = (uVar9 & 1) + 1;
        }
        goto LAB_00535bca;
      }
      _w = uVar2 << 5;
      uVar20 = (uVar9 & 1) + 1 + (uint)((uVar9 >> 1 & 1) != 0);
    }
    else {
      _w = uVar2 << 6;
      uVar20 = (uVar9 & 1) + (int)(uVar22 >> 3) + ((uint)(uVar22 >> 2) & 1) +
               (uint)((uVar9 >> 1 & 1) != 0);
    }
    uVar13 = (uVar3 & 1) + (uVar3 >> 3) + (uVar3 >> 2 & 1) + (uint)((uVar3 >> 1 & 1) != 0);
  }
LAB_00535bca:
  Mat::create(&this->weight_data_tm,_w,uVar20,uVar13,4,(Allocator *)0x0);
  uVar22 = 0;
  if (7 < (int)uVar3) {
    lVar5 = *(long *)(&this->field_0x148 + (long)p_Var4);
    iVar21 = uVar9 * uVar2;
    pvVar6 = (this->weight_data_tm).data;
    sVar7 = (this->weight_data_tm).elemsize;
    sVar8 = (this->weight_data_tm).cstep;
    lVar41 = (long)(int)uVar9;
    iVar30 = uVar2 * uVar9;
    iVar37 = iVar30 * 8;
    lVar1 = lVar31 * 4;
    iVar36 = iVar30 * 2;
    iVar25 = iVar30 * 3;
    iVar30 = iVar30 * 4;
    iVar27 = iVar21 * 5;
    iVar33 = iVar21 * 6;
    iVar14 = iVar21 * 7;
    iVar45 = 0;
    uVar40 = 0;
    do {
      puVar10 = (undefined4 *)((uVar40 >> 3) * sVar7 * sVar8 + (long)pvVar6);
      if ((int)uVar9 < 8) {
        uVar22 = 0;
      }
      else {
        lVar23 = 0;
        uVar52 = 0;
        do {
          if (0 < (int)uVar2) {
            uVar22 = 0;
            lVar28 = lVar23;
            do {
              puVar49 = puVar10;
              lVar50 = 0;
              lVar11 = lVar28;
              do {
                *(undefined4 *)((long)puVar49 + lVar50) =
                     *(undefined4 *)(lVar5 + (long)iVar45 * 4 + lVar11);
                *(undefined4 *)((long)puVar49 + lVar50 + 4) =
                     *(undefined4 *)(lVar5 + (long)iVar21 * 4 + lVar11);
                *(undefined4 *)((long)puVar49 + lVar50 + 8) =
                     *(undefined4 *)(lVar5 + (long)iVar36 * 4 + lVar11);
                *(undefined4 *)((long)puVar49 + lVar50 + 0xc) =
                     *(undefined4 *)(lVar5 + (long)iVar25 * 4 + lVar11);
                *(undefined4 *)((long)puVar49 + lVar50 + 0x10) =
                     *(undefined4 *)(lVar5 + (long)iVar30 * 4 + lVar11);
                *(undefined4 *)((long)puVar49 + lVar50 + 0x14) =
                     *(undefined4 *)(lVar5 + (long)iVar27 * 4 + lVar11);
                *(undefined4 *)((long)puVar49 + lVar50 + 0x18) =
                     *(undefined4 *)(lVar5 + (long)iVar33 * 4 + lVar11);
                *(undefined4 *)((long)puVar49 + lVar50 + 0x1c) =
                     *(undefined4 *)(lVar5 + (long)iVar14 * 4 + lVar11);
                lVar50 = lVar50 + 0x20;
                lVar11 = lVar11 + lVar1;
              } while ((int)lVar50 != 0x100);
              uVar22 = uVar22 + 1;
              lVar28 = lVar28 + 4;
              puVar10 = (undefined4 *)((long)puVar49 + lVar50);
            } while (uVar22 != uVar54);
            puVar10 = (undefined4 *)((long)puVar49 + lVar50);
          }
          uVar22 = uVar52 + 8;
          lVar28 = uVar52 + 0xf;
          lVar23 = lVar23 + uVar54 * 0x20;
          uVar52 = uVar22;
        } while (lVar28 < lVar41);
      }
      lVar38 = (long)iVar14 * 4;
      lVar50 = (long)iVar33 * 4;
      lVar51 = (long)iVar27 * 4;
      lVar56 = (long)iVar30 * 4;
      lVar28 = (long)iVar25 * 4;
      lVar11 = (long)iVar36 * 4;
      lVar42 = (long)iVar21 * 4;
      lVar23 = (long)iVar45 * 4;
      if ((int)((uint)uVar22 | 3) < (int)uVar9) {
        lVar46 = lVar1 * (uVar22 & 0xffffffff);
        lVar24 = 0;
        uVar52 = uVar22 & 0xffffffff;
        do {
          if (0 < (int)uVar2) {
            uVar22 = 0;
            lVar29 = lVar24;
            do {
              puVar49 = puVar10;
              lVar39 = 0;
              lVar12 = lVar29;
              do {
                *(undefined4 *)((long)puVar49 + lVar39) =
                     *(undefined4 *)(lVar46 + lVar23 + lVar5 + lVar12);
                *(undefined4 *)((long)puVar49 + lVar39 + 4) =
                     *(undefined4 *)(lVar46 + lVar42 + lVar5 + lVar12);
                *(undefined4 *)((long)puVar49 + lVar39 + 8) =
                     *(undefined4 *)(lVar11 + lVar46 + lVar5 + lVar12);
                *(undefined4 *)((long)puVar49 + lVar39 + 0xc) =
                     *(undefined4 *)(lVar46 + lVar28 + lVar5 + lVar12);
                *(undefined4 *)((long)puVar49 + lVar39 + 0x10) =
                     *(undefined4 *)(lVar46 + lVar56 + lVar5 + lVar12);
                *(undefined4 *)((long)puVar49 + lVar39 + 0x14) =
                     *(undefined4 *)(lVar46 + lVar51 + lVar5 + lVar12);
                *(undefined4 *)((long)puVar49 + lVar39 + 0x18) =
                     *(undefined4 *)(lVar46 + lVar50 + lVar5 + lVar12);
                *(undefined4 *)((long)puVar49 + lVar39 + 0x1c) =
                     *(undefined4 *)(lVar46 + lVar38 + lVar5 + lVar12);
                lVar39 = lVar39 + 0x20;
                lVar12 = lVar12 + lVar1;
              } while ((int)lVar39 != 0x80);
              uVar22 = uVar22 + 1;
              lVar29 = lVar29 + 4;
              puVar10 = (undefined4 *)((long)puVar49 + lVar39);
            } while (uVar22 != uVar54);
            puVar10 = (undefined4 *)((long)puVar49 + lVar39);
          }
          uVar22 = uVar52 + 4;
          lVar29 = uVar52 + 7;
          lVar24 = lVar24 + lVar31 * 0x10;
          uVar52 = uVar22;
        } while (lVar29 < lVar41);
      }
      if ((int)((uint)uVar22 | 1) < (int)uVar9) {
        lVar46 = lVar1 * (uVar22 & 0xffffffff);
        lVar24 = 0;
        uVar52 = uVar22 & 0xffffffff;
        do {
          if (0 < (int)uVar2) {
            uVar22 = 0;
            lVar29 = lVar24;
            do {
              puVar49 = puVar10;
              lVar39 = 0;
              lVar12 = lVar29;
              do {
                *(undefined4 *)((long)puVar49 + lVar39) =
                     *(undefined4 *)(lVar46 + lVar23 + lVar5 + lVar12);
                *(undefined4 *)((long)puVar49 + lVar39 + 4) =
                     *(undefined4 *)(lVar46 + lVar42 + lVar5 + lVar12);
                *(undefined4 *)((long)puVar49 + lVar39 + 8) =
                     *(undefined4 *)(lVar46 + lVar11 + lVar5 + lVar12);
                *(undefined4 *)((long)puVar49 + lVar39 + 0xc) =
                     *(undefined4 *)(lVar28 + lVar46 + lVar5 + lVar12);
                *(undefined4 *)((long)puVar49 + lVar39 + 0x10) =
                     *(undefined4 *)(lVar46 + lVar56 + lVar5 + lVar12);
                *(undefined4 *)((long)puVar49 + lVar39 + 0x14) =
                     *(undefined4 *)(lVar46 + lVar51 + lVar5 + lVar12);
                *(undefined4 *)((long)puVar49 + lVar39 + 0x18) =
                     *(undefined4 *)(lVar46 + lVar50 + lVar5 + lVar12);
                *(undefined4 *)((long)puVar49 + lVar39 + 0x1c) =
                     *(undefined4 *)(lVar46 + lVar38 + lVar5 + lVar12);
                lVar39 = lVar39 + 0x20;
                lVar12 = lVar12 + lVar1;
              } while ((int)lVar39 == 0x20);
              uVar22 = uVar22 + 1;
              lVar29 = lVar29 + 4;
              puVar10 = (undefined4 *)((long)puVar49 + lVar39);
            } while (uVar22 != uVar54);
            puVar10 = (undefined4 *)((long)puVar49 + lVar39);
          }
          uVar22 = uVar52 + 2;
          lVar29 = uVar52 + 3;
          lVar24 = lVar24 + lVar31 * 8;
          uVar52 = uVar22;
        } while (lVar29 < lVar41);
      }
      if ((int)uVar22 < (int)uVar9) {
        lVar29 = (long)(int)uVar22;
        lVar24 = lVar1 * lVar29;
        lVar46 = lVar38 + lVar24 + lVar5;
        lVar50 = lVar50 + lVar24 + lVar5;
        lVar12 = lVar51 + lVar24 + lVar5;
        lVar51 = lVar56 + lVar24 + lVar5;
        lVar28 = lVar28 + lVar24 + lVar5;
        lVar11 = lVar11 + lVar24 + lVar5;
        lVar38 = lVar42 + lVar24 + lVar5;
        lVar23 = lVar24 + lVar23 + lVar5;
        do {
          if (0 < (int)uVar2) {
            lVar42 = 0;
            puVar49 = puVar10;
            do {
              puVar19 = puVar49;
              puVar49 = puVar10 + lVar42 * 2;
              *puVar49 = *(undefined4 *)(lVar23 + lVar42);
              puVar49[1] = *(undefined4 *)(lVar38 + lVar42);
              puVar49[2] = *(undefined4 *)(lVar11 + lVar42);
              puVar49[3] = *(undefined4 *)(lVar28 + lVar42);
              puVar49[4] = *(undefined4 *)(lVar51 + lVar42);
              puVar49[5] = *(undefined4 *)(lVar12 + lVar42);
              puVar49[6] = *(undefined4 *)(lVar50 + lVar42);
              puVar49[7] = *(undefined4 *)(lVar46 + lVar42);
              lVar42 = lVar42 + 4;
              puVar49 = puVar49 + 8;
            } while (uVar54 * 4 != lVar42);
            puVar10 = puVar19 + 8;
          }
          lVar29 = lVar29 + 1;
          lVar46 = lVar46 + lVar1;
          lVar50 = lVar50 + lVar1;
          lVar12 = lVar12 + lVar1;
          lVar51 = lVar51 + lVar1;
          lVar28 = lVar28 + lVar1;
          lVar11 = lVar11 + lVar1;
          lVar38 = lVar38 + lVar1;
          lVar23 = lVar23 + lVar1;
        } while (lVar29 != lVar41);
      }
      uVar22 = uVar40 + 8;
      uVar52 = uVar40 + 0xf;
      iVar45 = iVar45 + iVar37;
      iVar21 = iVar21 + iVar37;
      iVar36 = iVar36 + iVar37;
      iVar25 = iVar25 + iVar37;
      iVar30 = iVar30 + iVar37;
      iVar27 = iVar27 + iVar37;
      iVar33 = iVar33 + iVar37;
      iVar14 = iVar14 + iVar37;
      uVar40 = uVar22;
    } while (uVar52 < uVar26);
  }
  uVar20 = (uint)uVar22;
  if ((int)(uVar20 | 3) < (int)uVar3) {
    lVar5 = *(long *)(&this->field_0x148 + (long)p_Var4);
    pvVar6 = (this->weight_data_tm).data;
    sVar7 = (this->weight_data_tm).elemsize;
    sVar8 = (this->weight_data_tm).cstep;
    lVar41 = (long)(int)uVar9;
    iVar25 = uVar2 * uVar9;
    iVar27 = (uVar20 | 3) * iVar25;
    iVar37 = iVar25 * 4;
    lVar23 = uVar54 * 0x20;
    lVar1 = lVar31 * 4;
    iVar25 = (uVar20 + 2) * iVar25;
    iVar33 = (uVar20 + 1) * uVar2 * uVar9;
    iVar36 = uVar2 * uVar9 * uVar20;
    uVar40 = uVar22 & 0xffffffff;
    do {
      puVar10 = (undefined4 *)
                ((ulong)(((uint)(uVar40 >> 3) & 0x1fffffff) + (uint)(((uint)uVar40 >> 2 & 1) != 0))
                 * sVar7 * sVar8 + (long)pvVar6);
      if ((int)uVar9 < 8) {
        uVar22 = 0;
      }
      else {
        lVar28 = lVar5 + (long)iVar27 * 4;
        lVar11 = lVar5 + (long)iVar25 * 4;
        lVar50 = lVar5 + (long)iVar33 * 4;
        lVar38 = lVar5 + (long)iVar36 * 4;
        uVar52 = 0;
        do {
          if (0 < (int)uVar2) {
            uVar22 = 0;
            lVar42 = lVar11;
            lVar51 = lVar28;
            lVar56 = lVar50;
            lVar24 = lVar38;
            do {
              puVar49 = puVar10;
              lVar29 = 0;
              lVar46 = 0;
              do {
                *(undefined4 *)((long)puVar49 + lVar46) = *(undefined4 *)(lVar24 + lVar29);
                *(undefined4 *)((long)puVar49 + lVar46 + 4) = *(undefined4 *)(lVar56 + lVar29);
                *(undefined4 *)((long)puVar49 + lVar46 + 8) = *(undefined4 *)(lVar42 + lVar29);
                *(undefined4 *)((long)puVar49 + lVar46 + 0xc) = *(undefined4 *)(lVar51 + lVar29);
                lVar46 = lVar46 + 0x10;
                lVar29 = lVar29 + lVar1;
              } while ((int)lVar46 != 0x80);
              uVar22 = uVar22 + 1;
              lVar51 = lVar51 + 4;
              lVar42 = lVar42 + 4;
              lVar56 = lVar56 + 4;
              lVar24 = lVar24 + 4;
              puVar10 = (undefined4 *)((long)puVar49 + lVar46);
            } while (uVar22 != uVar54);
            puVar10 = (undefined4 *)((long)puVar49 + lVar46);
          }
          uVar22 = uVar52 + 8;
          lVar42 = uVar52 + 0xf;
          lVar28 = lVar28 + lVar23;
          lVar11 = lVar11 + lVar23;
          lVar50 = lVar50 + lVar23;
          lVar38 = lVar38 + lVar23;
          uVar52 = uVar22;
        } while (lVar42 < lVar41);
      }
      lVar38 = (long)iVar27 * 4;
      lVar28 = (long)iVar25 * 4;
      lVar50 = (long)iVar33 * 4;
      lVar11 = (long)iVar36 * 4;
      if ((int)((uint)uVar22 | 3) < (int)uVar9) {
        lVar42 = lVar1 * (uVar22 & 0xffffffff);
        lVar51 = 0;
        uVar52 = uVar22 & 0xffffffff;
        do {
          if (0 < (int)uVar2) {
            uVar22 = 0;
            lVar56 = lVar51;
            do {
              puVar49 = puVar10;
              lVar46 = 0;
              lVar24 = lVar56;
              do {
                *(undefined4 *)((long)puVar49 + lVar46) =
                     *(undefined4 *)(lVar42 + lVar11 + lVar5 + lVar24);
                *(undefined4 *)((long)puVar49 + lVar46 + 4) =
                     *(undefined4 *)(lVar42 + lVar50 + lVar5 + lVar24);
                *(undefined4 *)((long)puVar49 + lVar46 + 8) =
                     *(undefined4 *)(lVar42 + lVar28 + lVar5 + lVar24);
                *(undefined4 *)((long)puVar49 + lVar46 + 0xc) =
                     *(undefined4 *)(lVar42 + lVar38 + lVar5 + lVar24);
                lVar46 = lVar46 + 0x10;
                lVar24 = lVar24 + lVar1;
              } while ((int)lVar46 != 0x40);
              uVar22 = uVar22 + 1;
              lVar56 = lVar56 + 4;
              puVar10 = (undefined4 *)((long)puVar49 + lVar46);
            } while (uVar22 != uVar54);
            puVar10 = (undefined4 *)((long)puVar49 + lVar46);
          }
          uVar22 = uVar52 + 4;
          lVar56 = uVar52 + 7;
          lVar51 = lVar51 + lVar31 * 0x10;
          uVar52 = uVar22;
        } while (lVar56 < lVar41);
      }
      if ((int)((uint)uVar22 | 1) < (int)uVar9) {
        lVar42 = lVar1 * (uVar22 & 0xffffffff);
        lVar51 = 0;
        uVar52 = uVar22 & 0xffffffff;
        do {
          if (0 < (int)uVar2) {
            uVar22 = 0;
            lVar56 = lVar51;
            do {
              puVar49 = puVar10;
              lVar46 = 0;
              lVar24 = lVar56;
              do {
                *(undefined4 *)((long)puVar49 + lVar46) =
                     *(undefined4 *)(lVar42 + lVar11 + lVar5 + lVar24);
                *(undefined4 *)((long)puVar49 + lVar46 + 4) =
                     *(undefined4 *)(lVar42 + lVar50 + lVar5 + lVar24);
                *(undefined4 *)((long)puVar49 + lVar46 + 8) =
                     *(undefined4 *)(lVar42 + lVar28 + lVar5 + lVar24);
                *(undefined4 *)((long)puVar49 + lVar46 + 0xc) =
                     *(undefined4 *)(lVar42 + lVar38 + lVar5 + lVar24);
                lVar46 = lVar46 + 0x10;
                lVar24 = lVar24 + lVar1;
              } while ((int)lVar46 == 0x10);
              uVar22 = uVar22 + 1;
              lVar56 = lVar56 + 4;
              puVar10 = (undefined4 *)((long)puVar49 + lVar46);
            } while (uVar22 != uVar54);
            puVar10 = (undefined4 *)((long)puVar49 + lVar46);
          }
          uVar22 = uVar52 + 2;
          lVar56 = uVar52 + 3;
          lVar51 = lVar51 + lVar31 * 8;
          uVar52 = uVar22;
        } while (lVar56 < lVar41);
      }
      if ((int)uVar22 < (int)uVar9) {
        lVar42 = (long)(int)uVar22;
        lVar51 = lVar1 * lVar42;
        lVar38 = lVar38 + lVar51 + lVar5;
        lVar28 = lVar28 + lVar51 + lVar5;
        lVar50 = lVar50 + lVar51 + lVar5;
        lVar11 = lVar51 + lVar11 + lVar5;
        do {
          if (0 < (int)uVar2) {
            lVar51 = 0;
            puVar49 = puVar10;
            do {
              puVar19 = puVar49;
              puVar49 = puVar10 + lVar51;
              *puVar49 = *(undefined4 *)(lVar11 + lVar51);
              puVar49[1] = *(undefined4 *)(lVar50 + lVar51);
              puVar49[2] = *(undefined4 *)(lVar28 + lVar51);
              puVar49[3] = *(undefined4 *)(lVar38 + lVar51);
              lVar51 = lVar51 + 4;
              puVar49 = puVar49 + 4;
            } while (uVar54 * 4 != lVar51);
            puVar10 = puVar19 + 4;
          }
          lVar42 = lVar42 + 1;
          lVar38 = lVar38 + lVar1;
          lVar28 = lVar28 + lVar1;
          lVar50 = lVar50 + lVar1;
          lVar11 = lVar11 + lVar1;
        } while (lVar42 != lVar41);
      }
      uVar22 = uVar40 + 4;
      lVar28 = uVar40 + 7;
      iVar27 = iVar27 + iVar37;
      iVar25 = iVar25 + iVar37;
      iVar33 = iVar33 + iVar37;
      iVar36 = iVar36 + iVar37;
      uVar40 = uVar22;
    } while (lVar28 < (long)uVar26);
  }
  uVar20 = (uint)uVar22 | 1;
  if ((int)uVar20 < (int)uVar3) {
    lVar42 = *(long *)(&this->field_0x148 + (long)p_Var4);
    pvVar6 = (this->weight_data_tm).data;
    sVar7 = (this->weight_data_tm).elemsize;
    sVar8 = (this->weight_data_tm).cstep;
    lVar24 = (long)(int)uVar9;
    lVar1 = lVar42 + (long)(int)(uVar2 * 7) * 4;
    iVar25 = uVar20 * uVar2 * uVar9;
    iVar37 = uVar2 * uVar9 * 2;
    lVar56 = uVar54 * 0x20;
    lVar5 = lVar42 + (long)(int)(uVar2 * 6) * 4;
    lVar41 = lVar42 + (long)(int)(uVar2 * 5) * 4;
    lVar23 = lVar42 + (long)(int)(uVar2 * 4) * 4;
    lVar28 = lVar42 + (long)(int)(uVar2 * 3) * 4;
    lVar11 = lVar42 + (long)(int)(uVar2 * 2) * 4;
    iVar36 = uVar2 * uVar9 * (uint)uVar22;
    lVar51 = lVar31 * 0x10;
    lVar38 = lVar31 * 4;
    lVar50 = lVar42 + lVar31 * 4;
    uVar40 = uVar22 & 0xffffffff;
    do {
      lVar29 = (long)iVar25;
      lVar46 = (long)iVar36;
      puVar10 = (undefined4 *)
                ((ulong)(((uint)(uVar40 >> 2) & 1) + ((uint)(uVar40 >> 3) & 0x1fffffff) +
                        (uint)(((uint)uVar40 >> 1 & 1) != 0)) * sVar7 * sVar8 + (long)pvVar6);
      if ((int)uVar9 < 8) {
        uVar22 = 0;
      }
      else {
        lVar12 = lVar1 + lVar29 * 4;
        lVar39 = lVar5 + lVar29 * 4;
        lVar34 = lVar41 + lVar29 * 4;
        lVar47 = lVar23 + lVar29 * 4;
        lVar32 = lVar28 + lVar29 * 4;
        lVar15 = lVar11 + lVar29 * 4;
        lVar53 = lVar50 + lVar29 * 4;
        lVar35 = lVar42 + lVar29 * 4;
        lVar48 = lVar1 + lVar46 * 4;
        lVar44 = lVar5 + lVar46 * 4;
        lVar55 = lVar41 + lVar46 * 4;
        lVar16 = lVar23 + lVar46 * 4;
        local_130 = lVar28 + lVar46 * 4;
        local_148 = lVar11 + lVar46 * 4;
        local_138 = lVar50 + lVar46 * 4;
        local_120 = lVar42 + lVar46 * 4;
        local_150 = 0;
        do {
          if (0 < (int)uVar2) {
            lVar43 = 0;
            do {
              *puVar10 = *(undefined4 *)(local_120 + lVar43);
              puVar10[1] = *(undefined4 *)(local_138 + lVar43);
              puVar10[2] = *(undefined4 *)(local_148 + lVar43);
              puVar10[3] = *(undefined4 *)(local_130 + lVar43);
              puVar10[4] = *(undefined4 *)(lVar16 + lVar43);
              puVar10[5] = *(undefined4 *)(lVar55 + lVar43);
              puVar10[6] = *(undefined4 *)(lVar44 + lVar43);
              puVar10[7] = *(undefined4 *)(lVar48 + lVar43);
              puVar10[8] = *(undefined4 *)(lVar35 + lVar43);
              puVar10[9] = *(undefined4 *)(lVar53 + lVar43);
              puVar10[10] = *(undefined4 *)(lVar15 + lVar43);
              puVar10[0xb] = *(undefined4 *)(lVar32 + lVar43);
              puVar10[0xc] = *(undefined4 *)(lVar47 + lVar43);
              puVar10[0xd] = *(undefined4 *)(lVar34 + lVar43);
              puVar10[0xe] = *(undefined4 *)(lVar39 + lVar43);
              puVar10[0xf] = *(undefined4 *)(lVar12 + lVar43);
              puVar10 = puVar10 + 0x10;
              lVar43 = lVar43 + 4;
            } while (uVar54 * 4 != lVar43);
          }
          uVar22 = local_150 + 8;
          lVar43 = local_150 + 0xf;
          lVar12 = lVar12 + lVar56;
          lVar39 = lVar39 + lVar56;
          lVar34 = lVar34 + lVar56;
          lVar47 = lVar47 + lVar56;
          lVar32 = lVar32 + lVar56;
          lVar15 = lVar15 + lVar56;
          lVar53 = lVar53 + lVar56;
          lVar35 = lVar35 + lVar56;
          lVar48 = lVar48 + lVar56;
          lVar44 = lVar44 + lVar56;
          lVar55 = lVar55 + lVar56;
          lVar16 = lVar16 + lVar56;
          local_130 = local_130 + lVar56;
          local_148 = local_148 + lVar56;
          local_138 = local_138 + lVar56;
          local_120 = local_120 + lVar56;
          local_150 = uVar22;
        } while (lVar43 < lVar24);
      }
      lVar29 = lVar29 * 4;
      lVar46 = lVar46 * 4;
      if ((int)((uint)uVar22 | 3) < (int)uVar9) {
        uVar52 = uVar22 & 0xffffffff;
        lVar12 = lVar38 * uVar52 + lVar29;
        lVar39 = lVar28 + lVar12;
        lVar34 = lVar12 + lVar11;
        lVar15 = (uVar52 * 4 + 4) * lVar31;
        lVar53 = lVar29 + lVar42 + lVar15;
        lVar12 = lVar12 + lVar42;
        lVar32 = lVar38 * uVar52 + lVar46;
        lVar35 = lVar28 + lVar32;
        lVar15 = lVar15 + lVar46 + lVar42;
        lVar47 = lVar32 + lVar11;
        lVar32 = lVar32 + lVar42;
        do {
          if (0 < (int)uVar2) {
            lVar48 = 0;
            puVar49 = puVar10;
            do {
              puVar19 = puVar49;
              puVar49 = puVar10 + lVar48 * 2;
              *puVar49 = *(undefined4 *)(lVar32 + lVar48);
              puVar49[1] = *(undefined4 *)(lVar15 + lVar48);
              puVar49[2] = *(undefined4 *)(lVar47 + lVar48);
              puVar49[3] = *(undefined4 *)(lVar35 + lVar48);
              puVar49[4] = *(undefined4 *)(lVar12 + lVar48);
              puVar49[5] = *(undefined4 *)(lVar53 + lVar48);
              puVar49[6] = *(undefined4 *)(lVar34 + lVar48);
              puVar49[7] = *(undefined4 *)(lVar39 + lVar48);
              lVar48 = lVar48 + 4;
              puVar49 = puVar49 + 8;
            } while (uVar54 * 4 != lVar48);
            puVar10 = puVar19 + 8;
          }
          uVar22 = uVar52 + 4;
          lVar48 = uVar52 + 7;
          lVar39 = lVar39 + lVar51;
          lVar34 = lVar34 + lVar51;
          lVar53 = lVar53 + lVar51;
          lVar12 = lVar12 + lVar51;
          lVar35 = lVar35 + lVar51;
          lVar47 = lVar47 + lVar51;
          lVar15 = lVar15 + lVar51;
          lVar32 = lVar32 + lVar51;
          uVar52 = uVar22;
        } while (lVar48 < lVar24);
      }
      if ((int)((uint)uVar22 | 1) < (int)uVar9) {
        lVar12 = lVar38 * (uVar22 & 0xffffffff);
        lVar39 = lVar12 + lVar29 + lVar42;
        lVar12 = lVar12 + lVar46 + lVar42;
        uVar52 = uVar22 & 0xffffffff;
        do {
          if (0 < (int)uVar2) {
            uVar22 = 0;
            lVar34 = lVar12;
            lVar47 = lVar39;
            do {
              puVar49 = puVar10;
              lVar32 = 0;
              lVar15 = 0;
              do {
                *(undefined4 *)((long)puVar49 + lVar15) = *(undefined4 *)(lVar34 + lVar32);
                *(undefined4 *)((long)puVar49 + lVar15 + 4) = *(undefined4 *)(lVar47 + lVar32);
                lVar15 = lVar15 + 8;
                lVar32 = lVar32 + lVar38;
              } while ((int)lVar15 == 8);
              uVar22 = uVar22 + 1;
              lVar47 = lVar47 + 4;
              lVar34 = lVar34 + 4;
              puVar10 = (undefined4 *)((long)puVar49 + lVar15);
            } while (uVar22 != uVar54);
            puVar10 = (undefined4 *)((long)puVar49 + lVar15);
          }
          uVar22 = uVar52 + 2;
          lVar34 = uVar52 + 3;
          lVar39 = lVar39 + lVar31 * 8;
          lVar12 = lVar12 + lVar31 * 8;
          uVar52 = uVar22;
        } while (lVar34 < lVar24);
      }
      if ((int)uVar22 < (int)uVar9) {
        lVar12 = (long)(int)uVar22;
        lVar29 = lVar29 + lVar38 * lVar12 + lVar42;
        lVar46 = lVar38 * lVar12 + lVar46 + lVar42;
        do {
          if (0 < (int)uVar2) {
            uVar22 = 0;
            do {
              *puVar10 = *(undefined4 *)(lVar46 + uVar22 * 4);
              puVar10[1] = *(undefined4 *)(lVar29 + uVar22 * 4);
              puVar10 = puVar10 + 2;
              uVar22 = uVar22 + 1;
            } while (uVar54 != uVar22);
          }
          lVar12 = lVar12 + 1;
          lVar29 = lVar29 + lVar38;
          lVar46 = lVar46 + lVar38;
        } while (lVar12 != lVar24);
      }
      uVar22 = uVar40 + 2;
      lVar46 = uVar40 + 3;
      iVar25 = iVar25 + iVar37;
      iVar36 = iVar36 + iVar37;
      uVar40 = uVar22;
    } while (lVar46 < (long)uVar26);
  }
  iVar37 = (int)uVar22;
  if (iVar37 < (int)uVar3) {
    lVar5 = *(long *)(&this->field_0x148 + (long)p_Var4);
    pvVar6 = (this->weight_data_tm).data;
    sVar7 = (this->weight_data_tm).elemsize;
    sVar8 = (this->weight_data_tm).cstep;
    lVar41 = (long)(int)uVar9;
    uVar22 = (ulong)iVar37;
    iVar37 = uVar2 * uVar9 * iVar37;
    lVar1 = lVar31 * 4;
    do {
      pvVar17 = (void *)((ulong)(((uint)uVar22 & 1) + ((uint)(uVar22 >> 3) & 0x1fffffff) +
                                 ((uint)(uVar22 >> 2) & 1) + (uint)(((uint)uVar22 >> 1 & 1) != 0)) *
                         sVar7 * sVar8 + (long)pvVar6);
      if ((int)uVar9 < 8) {
        uVar40 = 0;
      }
      else {
        puVar10 = (undefined4 *)(lVar5 + (long)iVar37 * 4);
        uVar52 = 0;
        do {
          if (0 < (int)uVar2) {
            uVar40 = 0;
            puVar49 = puVar10;
            do {
              pvVar18 = pvVar17;
              lVar23 = 0;
              puVar19 = puVar49;
              do {
                *(undefined4 *)((long)pvVar18 + lVar23) = *puVar19;
                lVar23 = lVar23 + 4;
                puVar19 = puVar19 + lVar31;
              } while ((int)lVar23 != 0x20);
              uVar40 = uVar40 + 1;
              puVar49 = puVar49 + 1;
              pvVar17 = (void *)((long)pvVar18 + lVar23);
            } while (uVar40 != uVar54);
            pvVar17 = (void *)((long)pvVar18 + lVar23);
          }
          uVar40 = uVar52 + 8;
          lVar23 = uVar52 + 0xf;
          puVar10 = puVar10 + uVar54 * 8;
          uVar52 = uVar40;
        } while (lVar23 < lVar41);
      }
      lVar23 = (long)iVar37 * 4;
      if ((int)((uint)uVar40 | 3) < (int)uVar9) {
        puVar10 = (undefined4 *)(lVar1 * (uVar40 & 0xffffffff) + lVar23 + lVar5);
        uVar52 = uVar40 & 0xffffffff;
        do {
          if (0 < (int)uVar2) {
            uVar40 = 0;
            puVar49 = puVar10;
            do {
              pvVar18 = pvVar17;
              lVar28 = 0;
              puVar19 = puVar49;
              do {
                *(undefined4 *)((long)pvVar18 + lVar28) = *puVar19;
                lVar28 = lVar28 + 4;
                puVar19 = puVar19 + lVar31;
              } while ((int)lVar28 != 0x10);
              uVar40 = uVar40 + 1;
              puVar49 = puVar49 + 1;
              pvVar17 = (void *)((long)pvVar18 + lVar28);
            } while (uVar40 != uVar54);
            pvVar17 = (void *)((long)pvVar18 + lVar28);
          }
          uVar40 = uVar52 + 4;
          lVar28 = uVar52 + 7;
          puVar10 = puVar10 + lVar31 * 4;
          uVar52 = uVar40;
        } while (lVar28 < lVar41);
      }
      if ((int)((uint)uVar40 | 1) < (int)uVar9) {
        puVar10 = (undefined4 *)(lVar1 * (uVar40 & 0xffffffff) + lVar23 + lVar5);
        uVar52 = uVar40 & 0xffffffff;
        do {
          if (0 < (int)uVar2) {
            uVar40 = 0;
            puVar49 = puVar10;
            do {
              pvVar18 = pvVar17;
              lVar28 = 0;
              puVar19 = puVar49;
              do {
                *(undefined4 *)((long)pvVar18 + lVar28) = *puVar19;
                lVar28 = lVar28 + 4;
                puVar19 = puVar19 + lVar31;
              } while ((int)lVar28 == 4);
              uVar40 = uVar40 + 1;
              puVar49 = puVar49 + 1;
              pvVar17 = (void *)((long)pvVar18 + lVar28);
            } while (uVar40 != uVar54);
            pvVar17 = (void *)((long)pvVar18 + lVar28);
          }
          uVar40 = uVar52 + 2;
          lVar28 = uVar52 + 3;
          puVar10 = puVar10 + lVar31 * 2;
          uVar52 = uVar40;
        } while (lVar28 < lVar41);
      }
      if ((int)uVar40 < (int)uVar9) {
        lVar28 = (long)(int)uVar40;
        lVar23 = lVar1 * lVar28 + lVar23 + lVar5;
        do {
          if (0 < (int)uVar2) {
            lVar11 = 0;
            do {
              *(undefined4 *)((long)pvVar17 + lVar11) = *(undefined4 *)(lVar23 + lVar11);
              lVar11 = lVar11 + 4;
            } while (uVar54 * 4 - lVar11 != 0);
            pvVar17 = (void *)((long)pvVar17 + lVar11);
          }
          lVar28 = lVar28 + 1;
          lVar23 = lVar23 + lVar1;
        } while (lVar28 != lVar41);
      }
      uVar22 = uVar22 + 1;
      iVar37 = iVar37 + uVar2 * uVar9;
    } while (uVar22 != uVar26);
  }
  return 0;
}

Assistant:

int Convolution1D_x86_fma::create_pipeline(const Option& /*opt*/)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    convolution1d_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w);

    return 0;
}